

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O3

void __thiscall
icu_63::RangeDescriptor::split(RangeDescriptor *this,UChar32 where,UErrorCode *status)

{
  RangeDescriptor *this_00;
  undefined4 in_register_00000034;
  RangeDescriptor *p;
  
  this_00 = (RangeDescriptor *)
            UMemory::operator_new((UMemory *)0x20,CONCAT44(in_register_00000034,where));
  if (this_00 == (RangeDescriptor *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    p = this;
    RangeDescriptor(this_00,this,status);
    if (U_ZERO_ERROR < *status) {
      if (this_00->fIncludesSets != (UVector *)0x0) {
        (*(this_00->fIncludesSets->super_UObject)._vptr_UObject[1])();
      }
      this_00->fIncludesSets = (UVector *)0x0;
      UMemory::operator_delete((UMemory *)this_00,p);
      return;
    }
    this_00->fStartChar = where;
    this->fEndChar = where + -1;
    this_00->fNext = this->fNext;
    this->fNext = this_00;
  }
  return;
}

Assistant:

void RangeDescriptor::split(UChar32 where, UErrorCode &status) {
    U_ASSERT(where>fStartChar && where<=fEndChar);
    RangeDescriptor *nr = new RangeDescriptor(*this, status);
    if(nr == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    if (U_FAILURE(status)) {
        delete nr;
        return;
    }
    //  RangeDescriptor copy constructor copies all fields.
    //  Only need to update those that are different after the split.
    nr->fStartChar = where;
    this->fEndChar = where-1;
    nr->fNext      = this->fNext;
    this->fNext    = nr;
}